

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O2

int Min_SopAddCubeInt(Min_Man_t *p,Min_Cube_t *pCube)

{
  Min_Cube_t **ppMVar1;
  Min_Cube_t *pMVar2;
  int iVar3;
  uint uVar4;
  int w;
  Min_Cube_t *in_RDX;
  Min_Cube_t *extraout_RDX;
  Min_Cube_t *extraout_RDX_00;
  Min_Cube_t *extraout_RDX_01;
  Min_Cube_t *pMVar5;
  ulong uVar6;
  ulong uVar7;
  Min_Cube_t *pMVar8;
  Min_Cube_t *pMVar9;
  
  ppMVar1 = p->ppStore;
  uVar6 = (ulong)(*(uint *)&pCube->field_0x8 >> 0x16);
  pMVar9 = (Min_Cube_t *)(ppMVar1 + uVar6);
  pMVar5 = pMVar9;
  do {
    pMVar5 = pMVar5->pNext;
    if (pMVar5 == (Min_Cube_t *)0x0) {
      uVar7 = 0;
      do {
        if (uVar7 == uVar6) {
          do {
            pMVar5 = pMVar9;
            pMVar9 = pMVar5->pNext;
            if (pMVar9 == (Min_Cube_t *)0x0) {
              uVar4 = *(uint *)&pCube->field_0x8;
              uVar6 = (ulong)(uVar4 >> 0x16);
              while (ppMVar1 = p->ppStore, uVar6 < (uVar4 & 0x3ff)) {
                uVar6 = uVar6 + 1;
                pMVar9 = (Min_Cube_t *)(ppMVar1 + uVar6);
                pMVar5 = pMVar9->pNext;
                if (pMVar5 != (Min_Cube_t *)0x0) goto LAB_003a4af5;
                pMVar2 = (Min_Cube_t *)0x0;
                pMVar8 = pMVar9;
                while (pMVar9 = pMVar5, pMVar5 = pMVar2, pMVar9 != (Min_Cube_t *)0x0) {
                  if ((pMVar9 != p->pBubble) &&
                     (iVar3 = Min_CubeIsContained(pCube,pMVar9), iVar3 != 0)) {
                    pMVar8->pNext = pMVar9->pNext;
                    Min_CubeRecycle(p,pMVar9);
                    p->nCubes = p->nCubes + -1;
                    pMVar9 = pMVar8;
                  }
                  pMVar2 = (Min_Cube_t *)0x0;
                  pMVar8 = pMVar9;
                  if (pMVar5 != (Min_Cube_t *)0x0) {
LAB_003a4af5:
                    pMVar2 = pMVar5->pNext;
                    pMVar8 = pMVar9;
                  }
                }
                uVar4 = *(uint *)&pCube->field_0x8;
              }
              pCube->pNext = ppMVar1[uVar4 >> 0x16];
              ppMVar1[uVar4 >> 0x16] = pCube;
              p->nCubes = p->nCubes + 1;
              return 0;
            }
            iVar3 = Min_CubesDistOne(pCube,pMVar9,in_RDX);
            in_RDX = extraout_RDX_01;
          } while (iVar3 == 0);
          pMVar5->pNext = pMVar9->pNext;
          uVar4 = *(uint *)&pCube->field_0x8;
          for (uVar6 = 0; (uVar4 >> 10 & 0xfff) != uVar6; uVar6 = uVar6 + 1) {
            pCube->uData[uVar6] = pCube->uData[uVar6] | pMVar9->uData[uVar6];
          }
          *(uint *)&pCube->field_0x8 = uVar4 - 0x400000;
          Min_CubeRecycle(p,pMVar9);
          p->nCubes = p->nCubes + -1;
          return 1;
        }
        pMVar5 = (Min_Cube_t *)(ppMVar1 + uVar7);
        while (pMVar5 = pMVar5->pNext, pMVar5 != (Min_Cube_t *)0x0) {
          if ((pMVar5 != p->pBubble) &&
             (iVar3 = Min_CubeIsContained(pMVar5,pCube), in_RDX = extraout_RDX_00, iVar3 != 0))
          goto LAB_003a4a11;
        }
        uVar7 = uVar7 + 1;
      } while( true );
    }
    iVar3 = Min_CubesAreEqual(pCube,pMVar5);
    in_RDX = extraout_RDX;
  } while (iVar3 == 0);
LAB_003a4a11:
  Min_CubeRecycle(p,pCube);
  return 0;
}

Assistant:

int Min_SopAddCubeInt( Min_Man_t * p, Min_Cube_t * pCube )
{
    Min_Cube_t * pThis, * pThis2, ** ppPrev;
    int i;
    // try to find the identical cube
    Min_CoverForEachCube( p->ppStore[pCube->nLits], pThis )
    {
        if ( Min_CubesAreEqual( pCube, pThis ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find a containing cube
    for ( i = 0; i < (int)pCube->nLits; i++ )
    Min_CoverForEachCube( p->ppStore[i], pThis )
    {
        if ( pThis != p->pBubble && Min_CubeIsContained( pThis, pCube ) )
        {
            Min_CubeRecycle( p, pCube );
            return 0;
        }
    }
    // try to find distance one in the same bin
    Min_CoverForEachCubePrev( p->ppStore[pCube->nLits], pThis, ppPrev )
    {
        if ( Min_CubesDistOne( pCube, pThis, NULL ) )
        {
            *ppPrev = pThis->pNext;
            Min_CubesTransformOr( pCube, pThis );
            pCube->nLits--;
            Min_CubeRecycle( p, pThis );
            p->nCubes--;
            return 1;
        }
    }

    // clean the other cubes using this one
    for ( i = pCube->nLits + 1; i <= (int)pCube->nVars; i++ )
    {
        ppPrev = &p->ppStore[i];
        Min_CoverForEachCubeSafe( p->ppStore[i], pThis, pThis2 )
        {
            if ( pThis != p->pBubble && Min_CubeIsContained( pCube, pThis ) )
            {
                *ppPrev = pThis->pNext;
                Min_CubeRecycle( p, pThis );
                p->nCubes--;
            }
            else
                ppPrev = &pThis->pNext;
        }
    }

    // add the cube
    pCube->pNext = p->ppStore[pCube->nLits];
    p->ppStore[pCube->nLits] = pCube;
    p->nCubes++;
    return 0;
}